

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void save_oct_double(char *filename,double *input,int in_len,double *output,int out_len)

{
  FILE *__s;
  ulong uVar1;
  
  printf("Dumping input and output data to file : %s.\n\n",filename);
  __s = fopen(filename,"w");
  if (__s != (FILE *)0x0) {
    fwrite("# Not created by Octave\n",0x18,1,__s);
    fwrite("# name: input\n",0xe,1,__s);
    fwrite("# type: matrix\n",0xf,1,__s);
    fprintf(__s,"# rows: %d\n",(ulong)(uint)in_len);
    fwrite("# columns: 1\n",0xd,1,__s);
    if (0 < in_len) {
      uVar1 = 0;
      do {
        fprintf(__s,"% g\n",input[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)in_len != uVar1);
    }
    fwrite("# name: output\n",0xf,1,__s);
    fwrite("# type: matrix\n",0xf,1,__s);
    fprintf(__s,"# rows: %d\n",(ulong)(uint)out_len);
    fwrite("# columns: 1\n",0xd,1,__s);
    if (0 < out_len) {
      uVar1 = 0;
      do {
        fprintf(__s,"% g\n",output[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)out_len != uVar1);
    }
    fclose(__s);
    return;
  }
  return;
}

Assistant:

void
save_oct_double (char *filename, double *input, int in_len, double *output, int out_len)
{	FILE 	*file ;
	int		k ;

	printf ("Dumping input and output data to file : %s.\n\n", filename) ;

	if (! (file = fopen (filename, "w")))
		return ;

	fprintf (file, "# Not created by Octave\n") ;

	fprintf (file, "# name: input\n") ;
	fprintf (file, "# type: matrix\n") ;
	fprintf (file, "# rows: %d\n", in_len) ;
	fprintf (file, "# columns: 1\n") ;

	for (k = 0 ; k < in_len ; k++)
		fprintf (file, "% g\n", input [k]) ;

	fprintf (file, "# name: output\n") ;
	fprintf (file, "# type: matrix\n") ;
	fprintf (file, "# rows: %d\n", out_len) ;
	fprintf (file, "# columns: 1\n") ;

	for (k = 0 ; k < out_len ; k++)
		fprintf (file, "% g\n", output [k]) ;

	fclose (file) ;
	return ;
}